

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Articulated_Parts_PDU::Encode(Articulated_Parts_PDU *this,KDataStream *stream)

{
  bool bVar1;
  reference this_00;
  VariableParameter *pVVar2;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Articulated_Parts_PDU *this_local;
  
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::operator<<(stream,this->m_ui8NumOfVariableParams);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
            ::begin(&this->m_vVariableParameters);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
       ::end(&this->m_vVariableParameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
              ::operator*(&citrEnd);
    pVVar2 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::operator->(this_00);
    (*(pVVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pVVar2,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Articulated_Parts_PDU::Encode( KDataStream & stream ) const
{
    LE_Header::Encode( stream );

    stream << m_ui8NumOfVariableParams;

    // Add the variable params
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ( *citr )->Encode( stream );
    }
}